

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

void __thiscall cs::name_space::copy_domain(name_space *this,domain_type *domain)

{
  bool bVar1;
  domain_type *in_RSI;
  long in_RDI;
  iterator iVar2;
  value_type *it;
  const_iterator __end2;
  const_iterator __begin2;
  domain_type *__range2;
  const_iterator *in_stack_ffffffffffffffa8;
  domain_type *in_stack_ffffffffffffffb0;
  domain_type *this_00;
  
  this_00 = in_RSI;
  iVar2 = (iterator)domain_type::begin_abi_cxx11_((domain_type *)0x42213c);
  domain_type::end_abi_cxx11_((domain_type *)0x422150);
  while( true ) {
    bVar1 = phmap::priv::operator!=
                      ((const_iterator *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    in_stack_ffffffffffffffb0 =
         (domain_type *)
         phmap::priv::
         raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
         ::const_iterator::operator*((const_iterator *)0x422179);
    in_stack_ffffffffffffffa8 = *(const_iterator **)(in_RDI + 8);
    domain_type::get_var_by_id(in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8);
    domain_type::add_var(this_00,(string *)in_RSI,(var *)iVar2.field_1.slot_);
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::const_iterator::operator++((const_iterator *)in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

void copy_domain(const domain_type &domain)
		{
			for (auto &it: domain)
				m_data->add_var(it.first, domain.get_var_by_id(it.second));
		}